

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

InlinedFrame ** __thiscall
Memory::AllocateArray<Memory::HeapAllocator,Js::InlinedFrameWalker::InlinedFrame*,false>
          (Memory *this,HeapAllocator *allocator,offset_in_HeapAllocator_to_subr AllocFunc,
          size_t count)

{
  InlinedFrame **ppIVar1;
  
  ppIVar1 = (InlinedFrame **)
            new__<Memory::HeapAllocator>
                      (-(ulong)(count >> 0x3d != 0) | count * 8,(HeapAllocator *)this,
                       (offset_in_HeapAllocator_to_subr)allocator);
  return ppIVar1;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}